

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O2

UnicodeString *
icu_63::DateTimePatternGenerator::staticGetBaseSkeleton
          (UnicodeString *__return_storage_ptr__,UnicodeString *pattern,UErrorCode *param_2)

{
  PtnSkeleton localSkeleton;
  FormatParser fp;
  PtnSkeleton local_dd0;
  DateTimeMatcher local_d40;
  FormatParser local_ca8;
  
  FormatParser::FormatParser(&local_ca8);
  local_dd0._vptr_PtnSkeleton = (_func_int **)&PTR__PtnSkeleton_004638a8;
  local_dd0.original.chars[0] = '\0';
  local_dd0.original.chars[1] = '\0';
  local_dd0.original.chars[2] = '\0';
  local_dd0.original.chars[3] = '\0';
  local_dd0.original.chars[4] = '\0';
  local_dd0.original.chars[5] = '\0';
  local_dd0.original.chars[6] = '\0';
  local_dd0.original.chars[7] = '\0';
  local_dd0.original.chars[8] = '\0';
  local_dd0.original.chars[9] = '\0';
  local_dd0.original.chars[10] = '\0';
  local_dd0.original.chars[0xb] = '\0';
  local_dd0.original.chars[0xc] = '\0';
  local_dd0.original.chars[0xd] = '\0';
  local_dd0.original.chars[0xe] = '\0';
  local_dd0.original.chars[0xf] = '\0';
  local_dd0.original.lengths[0] = '\0';
  local_dd0.original.lengths[1] = '\0';
  local_dd0.original.lengths[2] = '\0';
  local_dd0.original.lengths[3] = '\0';
  local_dd0.original.lengths[4] = '\0';
  local_dd0.original.lengths[5] = '\0';
  local_dd0.original.lengths[6] = '\0';
  local_dd0.original.lengths[7] = '\0';
  local_dd0.original.lengths[8] = '\0';
  local_dd0.original.lengths[9] = '\0';
  local_dd0.original.lengths[10] = '\0';
  local_dd0.original.lengths[0xb] = '\0';
  local_dd0.original.lengths[0xc] = '\0';
  local_dd0.original.lengths[0xd] = '\0';
  local_dd0.original.lengths[0xe] = '\0';
  local_dd0.original.lengths[0xf] = '\0';
  local_dd0.baseOriginal.chars[0] = '\0';
  local_dd0.baseOriginal.chars[1] = '\0';
  local_dd0.baseOriginal.chars[2] = '\0';
  local_dd0.baseOriginal.chars[3] = '\0';
  local_dd0.baseOriginal.chars[4] = '\0';
  local_dd0.baseOriginal.chars[5] = '\0';
  local_dd0.baseOriginal.chars[6] = '\0';
  local_dd0.baseOriginal.chars[7] = '\0';
  local_dd0.baseOriginal.chars[8] = '\0';
  local_dd0.baseOriginal.chars[9] = '\0';
  local_dd0.baseOriginal.chars[10] = '\0';
  local_dd0.baseOriginal.chars[0xb] = '\0';
  local_dd0.baseOriginal.chars[0xc] = '\0';
  local_dd0.baseOriginal.chars[0xd] = '\0';
  local_dd0.baseOriginal.chars[0xe] = '\0';
  local_dd0.baseOriginal.chars[0xf] = '\0';
  local_dd0.baseOriginal.lengths[0] = '\0';
  local_dd0.baseOriginal.lengths[1] = '\0';
  local_dd0.baseOriginal.lengths[2] = '\0';
  local_dd0.baseOriginal.lengths[3] = '\0';
  local_dd0.baseOriginal.lengths[4] = '\0';
  local_dd0.baseOriginal.lengths[5] = '\0';
  local_dd0.baseOriginal.lengths[6] = '\0';
  local_dd0.baseOriginal.lengths[7] = '\0';
  local_dd0.baseOriginal.lengths[8] = '\0';
  local_dd0.baseOriginal.lengths[9] = '\0';
  local_dd0.baseOriginal.lengths[10] = '\0';
  local_dd0.baseOriginal.lengths[0xb] = '\0';
  local_dd0.baseOriginal.lengths[0xc] = '\0';
  local_dd0.baseOriginal.lengths[0xd] = '\0';
  local_dd0.baseOriginal.lengths[0xe] = '\0';
  local_dd0.baseOriginal.lengths[0xf] = '\0';
  DateTimeMatcher::set(&local_d40,pattern,&local_ca8,&local_dd0);
  PtnSkeleton::getBaseSkeleton(__return_storage_ptr__,&local_dd0);
  FormatParser::~FormatParser(&local_ca8);
  return __return_storage_ptr__;
}

Assistant:

UnicodeString
DateTimePatternGenerator::staticGetBaseSkeleton(
        const UnicodeString& pattern, UErrorCode& /*status*/) {
    FormatParser fp;
    DateTimeMatcher matcher;
    PtnSkeleton localSkeleton;
    matcher.set(pattern, &fp, localSkeleton);
    return localSkeleton.getBaseSkeleton();
}